

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_(Formatter *this,Option *opt,bool is_positional)

{
  byte in_CL;
  undefined8 in_RDX;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  stringstream out;
  undefined1 local_238 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  stringstream local_1a8 [399];
  byte local_19;
  undefined8 local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  (**(code **)(*in_RSI + 0x60))(&stack0xfffffffffffffe18,in_RSI,local_18,local_19 & 1);
  (**(code **)(*in_RSI + 0x68))(&stack0xfffffffffffffde8,in_RSI,local_18);
  ::std::operator+(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  (**(code **)(*in_RSI + 0x70))(local_238,in_RSI,local_18);
  CLI::detail::format_help
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return (string *)in_RDI;
}

Assistant:

virtual std::string make_option(const Option *opt, bool is_positional) const {
        std::stringstream out;
        detail::format_help(
            out, make_option_name(opt, is_positional) + make_option_opts(opt), make_option_desc(opt), column_width_);
        return out.str();
    }